

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O0

int __thiscall
FName::NameManager::FindName(NameManager *this,char *text,size_t textLen,bool noCreate)

{
  uint hash_00;
  int iVar1;
  int local_38;
  int scanner;
  uint bucket;
  uint hash;
  bool noCreate_local;
  size_t textLen_local;
  char *text_local;
  NameManager *this_local;
  
  if (!Inited) {
    InitBuckets(this);
  }
  if (text == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    hash_00 = MakeKey(text,textLen);
    for (local_38 = this->Buckets[hash_00 & 0x3ff]; -1 < local_38;
        local_38 = this->NameArray[local_38].NextHash) {
      if (((this->NameArray[local_38].Hash == hash_00) &&
          (iVar1 = strncasecmp(this->NameArray[local_38].Text,text,textLen), iVar1 == 0)) &&
         (this->NameArray[local_38].Text[textLen] == '\0')) {
        return local_38;
      }
    }
    if (noCreate) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = AddName(this,text,hash_00,hash_00 & 0x3ff);
    }
  }
  return this_local._4_4_;
}

Assistant:

int FName::NameManager::FindName (const char *text, size_t textLen, bool noCreate)
{
	if (!Inited)
	{
		InitBuckets ();
	}

	if (text == NULL)
	{
		return 0;
	}

	unsigned int hash = MakeKey (text, textLen);
	unsigned int bucket = hash % HASH_SIZE;
	int scanner = Buckets[bucket];

	// See if the name already exists.
	while (scanner >= 0)
	{
		if (NameArray[scanner].Hash == hash &&
			strnicmp (NameArray[scanner].Text, text, textLen) == 0 &&
			NameArray[scanner].Text[textLen] == '\0')
		{
			return scanner;
		}
		scanner = NameArray[scanner].NextHash;
	}

	// If we get here, then the name does not exist.
	if (noCreate)
	{
		return 0;
	}

	return AddName (text, hash, bucket);
}